

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O1

WatchID __thiscall
efsw::FileWatcherGeneric::addWatch
          (FileWatcherGeneric *this,string *directory,FileWatchListener *watcher,bool recursive)

{
  size_t *psVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  Error EVar5;
  WatcherGeneric *this_00;
  _List_node_base *p_Var6;
  WatchID WVar7;
  _Alloc_hider _Var8;
  long id;
  string dir;
  string link;
  string curPath;
  FileInfo fi;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  FileInfo local_78;
  
  pcVar2 = (directory->_M_dataplus)._M_p;
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pcVar2,pcVar2 + directory->_M_string_length);
  FileSystem::dirAddSlashAtEnd(&local_198);
  FileInfo::FileInfo(&local_78,&local_198);
  bVar3 = FileInfo::isDirectory(&local_78);
  if (bVar3) {
    bVar3 = FileInfo::isReadable(&local_78);
    if (bVar3) {
      iVar4 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[10])(this,&local_198);
      if ((char)iVar4 == '\0') {
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        local_158._M_string_length = 0;
        local_158.field_2._M_local_buf[0] = '\0';
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,local_198._M_dataplus._M_p,
                   local_198._M_dataplus._M_p + local_198._M_string_length);
        FileSystem::getLinkRealPath(&local_178,&local_f8,&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_178);
        if (iVar4 == 0) {
LAB_0011837c:
          id = this->mLastWatchID + 1;
          this->mLastWatchID = id;
          this_00 = (WatcherGeneric *)operator_new(0x70);
          WatcherGeneric::WatcherGeneric
                    (this_00,id,&local_198,watcher,&this->super_FileWatcherImpl,recursive);
          Mutex::lock(&this->mWatchesLock);
          p_Var6 = (_List_node_base *)operator_new(0x18);
          p_Var6[1]._M_next = (_List_node_base *)this_00;
          std::__detail::_List_node_base::_M_hook(p_Var6);
          psVar1 = &(this->mWatches).
                    super__List_base<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          Mutex::unlock(&this->mWatchesLock);
          WVar7 = (this_00->super_Watcher).ID;
        }
        else {
          iVar4 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[10])(this,&local_178);
          if ((char)iVar4 == '\0') {
            iVar4 = (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[9])
                              (this,&local_158,&local_178);
            if ((char)iVar4 != '\0') {
              std::__cxx11::string::_M_assign((string *)&local_198);
              goto LAB_0011837c;
            }
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_138,local_198._M_dataplus._M_p,
                       local_198._M_dataplus._M_p + local_198._M_string_length);
            EVar5 = Errors::Log::createLastError(FileOutOfScope,&local_138);
            WVar7 = (WatchID)EVar5;
            _Var8._M_p = local_138._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) goto LAB_00118424;
          }
          else {
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_118,local_198._M_dataplus._M_p,
                       local_198._M_dataplus._M_p + local_198._M_string_length);
            EVar5 = Errors::Log::createLastError(FileRepeated,&local_118);
            WVar7 = (WatchID)EVar5;
            local_138.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
            _Var8._M_p = local_118._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
LAB_00118424:
              operator_delete(_Var8._M_p,local_138.field_2._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p == &local_158.field_2) goto LAB_00118463;
        local_98.field_2._M_allocated_capacity =
             CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                      local_158.field_2._M_local_buf[0]);
        _Var8._M_p = local_158._M_dataplus._M_p;
      }
      else {
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,local_198._M_dataplus._M_p,
                   local_198._M_dataplus._M_p + local_198._M_string_length);
        EVar5 = Errors::Log::createLastError(FileRepeated,&local_d8);
        WVar7 = (WatchID)EVar5;
        local_98.field_2._M_allocated_capacity = local_d8.field_2._M_allocated_capacity;
        _Var8._M_p = local_d8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p == &local_d8.field_2) goto LAB_00118463;
      }
    }
    else {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,local_198._M_dataplus._M_p,
                 local_198._M_dataplus._M_p + local_198._M_string_length);
      EVar5 = Errors::Log::createLastError(FileNotReadable,&local_b8);
      WVar7 = (WatchID)EVar5;
      local_98.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
      _Var8._M_p = local_b8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == &local_b8.field_2) goto LAB_00118463;
    }
  }
  else {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_198._M_dataplus._M_p,
               local_198._M_dataplus._M_p + local_198._M_string_length);
    EVar5 = Errors::Log::createLastError(FileNotFound,&local_98);
    WVar7 = (WatchID)EVar5;
    _Var8._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_00118463;
  }
  operator_delete(_Var8._M_p,local_98.field_2._M_allocated_capacity + 1);
LAB_00118463:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.Filepath._M_dataplus._M_p != &local_78.Filepath.field_2) {
    operator_delete(local_78.Filepath._M_dataplus._M_p,
                    local_78.Filepath.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  return WVar7;
}

Assistant:

WatchID FileWatcherGeneric::addWatch(const std::string& directory, FileWatchListener* watcher, bool recursive)
{
	std::string dir( directory );

	FileSystem::dirAddSlashAtEnd( dir );

	FileInfo fi( dir );

	if ( !fi.isDirectory() )
	{
		return Errors::Log::createLastError( Errors::FileNotFound, dir );
	}
	else if ( !fi.isReadable() )
	{
		return Errors::Log::createLastError( Errors::FileNotReadable, dir );
	}
	else if ( pathInWatches( dir ) )
	{
		return Errors::Log::createLastError( Errors::FileRepeated, dir );
	}

	std::string curPath;
	std::string link( FileSystem::getLinkRealPath( dir, curPath ) );

	if ( "" != link )
	{
		if ( pathInWatches( link ) )
		{
			return Errors::Log::createLastError( Errors::FileRepeated, dir );
		}
		else if ( !linkAllowed( curPath, link ) )
		{
			return Errors::Log::createLastError( Errors::FileOutOfScope, dir );
		}
		else
		{
			dir = link;
		}
	}

	mLastWatchID++;

	WatcherGeneric * pWatch		= new WatcherGeneric( mLastWatchID, dir, watcher, this, recursive );

	mWatchesLock.lock();
	mWatches.push_back(pWatch);
	mWatchesLock.unlock();

	return pWatch->ID;
}